

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

void __thiscall
cmFileAPI::BuildClientRequestCodeModel
          (cmFileAPI *this,ClientRequest *r,
          vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *versions)

{
  pointer pRVar1;
  pointer pRVar2;
  string local_30;
  
  pRVar1 = (versions->
           super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    pRVar2 = pRVar1;
    if (pRVar2 == (versions->
                  super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      if ((r->super_Object).Version != 0) {
        return;
      }
      NoSupportedVersion_abi_cxx11_(&local_30,(cmFileAPI *)versions,versions);
      std::__cxx11::string::operator=((string *)&r->Error,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return;
    }
    pRVar1 = pRVar2 + 1;
  } while ((pRVar2->Major != 2) || (pRVar2->Minor != 0));
  (r->super_Object).Version = 2;
  return;
}

Assistant:

void cmFileAPI::BuildClientRequestCodeModel(
  ClientRequest& r, std::vector<RequestVersion> const& versions)
{
  // Select a known version from those requested.
  for (RequestVersion const& v : versions) {
    if ((v.Major == 2 && v.Minor <= CodeModelV2Minor)) {
      r.Version = v.Major;
      break;
    }
  }
  if (!r.Version) {
    r.Error = NoSupportedVersion(versions);
  }
}